

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::IsFrozen
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance)

{
  bool bVar1;
  int iVar2;
  DictionaryPropertyDescriptor<int> *this_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  BOOL BVar3;
  int iVar4;
  
  BVar3 = 0;
  if (((this->super_DynamicTypeHandler).flags & 1) == 0) {
    this_01 = (this->propertyMap).ptr;
    if (0 < this_01->count - this_01->freeCount) {
      iVar4 = 0;
      do {
        this_00 = JsUtil::
                  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::GetReferenceAt(this_01,iVar4);
        if ((this_00->Attributes & 0x18) == 0) {
          if ((this_00->Attributes & 2) != 0) {
            return 0;
          }
          iVar2 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(this_00);
          if ((iVar2 != -1) && ((this_00->Attributes & 4) != 0)) {
            return 0;
          }
        }
        iVar4 = iVar4 + 1;
        this_01 = (this->propertyMap).ptr;
      } while (iVar4 < this_01->count - this_01->freeCount);
    }
    bVar1 = DynamicObject::HasObjectArray(instance);
    if ((*(long **)&(instance->field_1).field_1 != (long *)0x0 && bVar1) &&
       (iVar4 = (**(code **)(**(long **)&(instance->field_1).field_1 + 0x370))(), iVar4 == 0)) {
      return 0;
    }
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::IsFrozen(DynamicObject* instance)
    {
        if (this->GetFlags() & IsExtensibleFlag)
        {
            return false;
        }

        DictionaryPropertyDescriptor<T> *descriptor = nullptr;
        for (T index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if ((!(descriptor->Attributes & PropertyDeleted) && !(descriptor->Attributes & PropertyLetConstGlobal)))
            {
                if (descriptor->Attributes & PropertyConfigurable)
                {
                    return false;
                }

                if (descriptor->template GetDataPropertyIndex<false>() != NoSlots && (descriptor->Attributes & PropertyWritable))
                {
                    // Only data descriptor has [[Writable]] property
                    return false;
                }
            }
        }

        // Use IsObjectArrayFrozen() to skip "length" [[Writable]] check
        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray && !objectArray->IsObjectArrayFrozen())
        {
            return false;
        }

        return true;
    }